

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-raw-file.c
# Opt level: O2

int rops_adoption_bind_raw_file(lws *wsi,int type,char *vh_prot_name)

{
  lws_vhost *plVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((type & 0x1000003U) == 0) {
    lws_role_transition(wsi,0,LRS_ESTABLISHED,&role_ops_raw_file);
    if (vh_prot_name == (char *)0x0) {
      plVar1 = wsi->vhost;
      if (plVar1->count_protocols <= (int)(uint)plVar1->default_protocol_index) {
        return 0;
      }
      wsi->protocol = plVar1->protocols + plVar1->default_protocol_index;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
rops_adoption_bind_raw_file(struct lws *wsi, int type, const char *vh_prot_name)
{
	/* no socket or http: it can only be a raw file */
	if ((type & LWS_ADOPT_HTTP) || (type & LWS_ADOPT_SOCKET) ||
	    (type & _LWS_ADOPT_FINISH))
		return 0; /* no match */

	lws_role_transition(wsi, 0, LRS_ESTABLISHED, &role_ops_raw_file);

	if (!vh_prot_name) {
		if (wsi->vhost->default_protocol_index >=
		    wsi->vhost->count_protocols)
			return 0;

		wsi->protocol = &wsi->vhost->protocols[
					wsi->vhost->default_protocol_index];
	}

	return 1; /* bound */
}